

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O1

int tinyusdz::USDZSizeAsset(char *resolved_asset_name,uint64_t *nbytes,string *err,void *userdata)

{
  ulong uVar1;
  ulong uVar2;
  string *psVar3;
  size_t sVar4;
  const_iterator cVar5;
  mapped_type *pmVar6;
  long *plVar7;
  long *plVar8;
  size_type *psVar9;
  uint64_t uVar10;
  key_type local_98;
  string *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  if (((userdata == (void *)0x0) || (resolved_asset_name == (char *)0x0)) ||
     (nbytes == (uint64_t *)0x0)) {
    if (err == (string *)0x0) {
      return -2;
    }
  }
  else {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_78 = err;
    sVar4 = strlen(resolved_asset_name);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,resolved_asset_name,resolved_asset_name + sVar4);
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                    *)userdata,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    psVar3 = local_78;
    if (cVar5._M_node == (_Base_ptr)((long)userdata + 8)) {
      if (local_78 == (string *)0x0) {
        return -1;
      }
      local_50[0] = local_40;
      sVar4 = strlen(resolved_asset_name);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,resolved_asset_name,resolved_asset_name + sVar4);
      plVar7 = (long *)::std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x3f2bce);
      plVar8 = plVar7 + 2;
      if ((long *)*plVar7 == plVar8) {
        local_60 = *plVar8;
        lStack_58 = plVar7[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar8;
        local_70 = (long *)*plVar7;
      }
      local_68 = plVar7[1];
      *plVar7 = (long)plVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)::std::__cxx11::string::append((char *)&local_70);
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_98.field_2._M_allocated_capacity = *psVar9;
        local_98.field_2._8_8_ = plVar7[3];
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar9;
        local_98._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_98._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)psVar3,(ulong)local_98._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_50[0] == local_40) {
        return -1;
      }
      operator_delete(local_50[0],local_40[0] + 1);
      return -1;
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    sVar4 = strlen(resolved_asset_name);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,resolved_asset_name,resolved_asset_name + sVar4);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
             ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                   *)userdata,&local_98);
    err = local_78;
    uVar1 = pmVar6->first;
    uVar2 = pmVar6->second;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    uVar10 = uVar2 - uVar1;
    if (uVar1 <= uVar2 && uVar10 != 0) {
      *nbytes = uVar10;
      return 0;
    }
    if (err == (string *)0x0) {
      return -2;
    }
  }
  ::std::__cxx11::string::append((char *)err);
  return -2;
}

Assistant:

int USDZSizeAsset(const char *resolved_asset_name, uint64_t *nbytes, std::string *err, void *userdata) {

  if (!userdata) {
    if (err) {
      (*err) += "`userdata` must be non-null.\n";
    }
    return -2;
  }

  if (!resolved_asset_name) {
    if (err) {
      (*err) += "`resolved_asset_name` must be non-null.\n";
    }
    return -2;
  }

  if (!nbytes) {
    if (err) {
      (*err) += "`nbytes` must be non-null.\n";
    }
    return -2;
  }

  const USDZAsset *passet = reinterpret_cast<const USDZAsset *>(userdata);

  if (!passet->asset_map.count(resolved_asset_name)) {
    if (err) {
      (*err) += "resolved_asset_name `" + std::string(resolved_asset_name) + "` not found in USDZAsset.\n";
    }
    return -1;
  }

  std::pair<size_t, size_t> byte_range = passet->asset_map.at(resolved_asset_name);

  if (byte_range.first >= byte_range.second) {
    if (err) {
      (*err) += "Invalid USDZAsset byte range.\n";
    }
    return -2;
  }

  (*nbytes) = byte_range.second - byte_range.first;

  return 0;
}